

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O2

int anon_unknown.dwarf_7357::RtMidi_getversion(lua_State *L)

{
  string str;
  
  RtMidi::getVersion_abi_cxx11_();
  lua_pushlstring(L,str._M_dataplus._M_p,str._M_string_length);
  std::__cxx11::string::~string((string *)&str);
  return 1;
}

Assistant:

int RtMidi_getversion(lua_State *L) {
	auto str = RtMidi::getVersion();
	lua_pushlstring(L, str.c_str(), str.size());
	return 1;
}